

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epochguard.h
# Opt level: O0

bool __thiscall Epoch::visited(Epoch *this,Marker *marker)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *in_RSI;
  ulong *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[1] & 1) == 0) {
    __assert_fail("m_guarded",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/epochguard.h"
                  ,0x59,"bool Epoch::visited(Marker &) const");
  }
  uVar2 = *in_RSI;
  uVar3 = *in_RDI;
  if (uVar3 > uVar2) {
    *in_RSI = *in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar3 <= uVar2;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(*this)
    {
        assert(m_guarded);
        if (marker.m_marker < m_raw_epoch) {
            // marker is from a previous epoch, so this is its first visit
            marker.m_marker = m_raw_epoch;
            return false;
        } else {
            return true;
        }
    }